

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_sense_disturbance(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  
  bVar1 = is_affected(ch,sn);
  if (bVar1) {
    send_to_char("You already sense disturbances in the air.\n\r",ch);
    return;
  }
  init_affect(&af);
  af.where = 0;
  af.aftype = get_spell_aftype(ch);
  af.type = (short)sn;
  af.level = (short)level;
  af.duration = (short)(level / 2);
  af.location = 0;
  af.modifier = 0;
  af.mod_name = 0xb;
  affect_to_char(ch,&af);
  send_to_char("You attune yourself to notice disturbances in the air around you.\n\r",ch);
  return;
}

Assistant:

void spell_sense_disturbance(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, sn))
	{
		send_to_char("You already sense disturbances in the air.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.type = sn;
	af.level = level;
	af.duration = level / 2;
	af.location = APPLY_NONE;
	af.modifier = 0;
	af.mod_name = MOD_PERCEPTION;
	affect_to_char(ch, &af);

	send_to_char("You attune yourself to notice disturbances in the air around you.\n\r", ch);
}